

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O1

void __thiscall CgroupController::delay_enter(CgroupController *this)

{
  int iVar1;
  ContextManager *pCVar2;
  path path;
  path local_60;
  path local_38;
  
  if (this->enter_fd_ == -1) {
    std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
              (&local_60,(char (*) [6])"tasks",auto_format);
    std::filesystem::__cxx11::operator/(&local_38,&this->path_,&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    iVar1 = open(local_38._M_pathname._M_dataplus._M_p,0x80001);
    this->enter_fd_ = iVar1;
    if (iVar1 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_60._M_pathname,"Cannot open file \'%s\' for writing: %m",
                        local_38._M_pathname._M_dataplus._M_p);
      (**pCVar2->_vptr_ContextManager)(pCVar2,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_pathname._M_dataplus._M_p != &local_60._M_pathname.field_2) {
        operator_delete(local_60._M_pathname._M_dataplus._M_p,
                        local_60._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::~path(&local_38);
  }
  return;
}

Assistant:

void CgroupController::delay_enter() {
    if (enter_fd_ != -1) {
        return;
    }
    fs::path path = path_ / "tasks";
    enter_fd_ = open(path.c_str(), O_WRONLY | O_CLOEXEC);
    if (enter_fd_ < 0) {
        die(format("Cannot open file '%s' for writing: %m", path.c_str()));
    }
}